

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O2

_Bool pmp_hart_has_privs_riscv64
                (CPURISCVState_conflict2 *env,target_ulong addr,target_ulong size,pmp_priv_t privs,
                target_ulong mode)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  target_ulong *ptVar5;
  uint uVar6;
  int iVar7;
  
  if ((env->pmp_state).num_rules == 0) {
    return true;
  }
  iVar2 = -((uint)addr | 0xfffff000);
  if (size != 0) {
    iVar2 = (int)size;
  }
  uVar4 = (addr + (long)iVar2) - 1;
  ptVar5 = &(env->pmp_state).addr[0].ea;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x10) {
      return mode == 3;
    }
    iVar2 = 1;
    if ((addr < ((pmp_addr_t_conflict *)(ptVar5 + -1))->sa) || (iVar7 = iVar2, *ptVar5 < addr)) {
      iVar7 = 0;
    }
    if ((uVar4 < ((pmp_addr_t_conflict *)(ptVar5 + -1))->sa) || (*ptVar5 < uVar4)) {
      iVar2 = 0;
    }
    if (iVar2 + iVar7 == 1) break;
    if ((iVar2 + iVar7 == 2) && (uVar1 = ptVar5[-0x20], ((byte)uVar1 & 0x18) != 0)) {
      if ((mode == 3) && (iVar2 = pmp_is_locked(env,(uint32_t)lVar3), iVar2 == 0)) {
        uVar6 = 7;
      }
      else {
        uVar6 = (byte)uVar1 & 7;
      }
      return (privs & ~uVar6) == 0;
    }
    lVar3 = lVar3 + 1;
    ptVar5 = ptVar5 + 2;
  }
  return false;
}

Assistant:

bool pmp_hart_has_privs(CPURISCVState *env, target_ulong addr,
    target_ulong size, pmp_priv_t privs, target_ulong mode)
{
    int i = 0;
    int ret = -1;
    int pmp_size = 0;
    target_ulong s = 0;
    target_ulong e = 0;
    pmp_priv_t allowed_privs = 0;

    /* Short cut if no rules */
    if (0 == pmp_get_num_rules(env)) {
        return true;
    }

    /*
     * if size is unknown (0), assume that all bytes
     * from addr to the end of the page will be accessed.
     */
    if (size == 0) {
#ifdef _MSC_VER
        pmp_size = 0 - (addr | TARGET_PAGE_MASK);
#else
        pmp_size = -(addr | TARGET_PAGE_MASK);
#endif
    } else {
        pmp_size = size;
    }

    /* 1.10 draft priv spec states there is an implicit order
         from low to high */
    for (i = 0; i < MAX_RISCV_PMPS; i++) {
        s = pmp_is_in_range(env, i, addr);
        e = pmp_is_in_range(env, i, addr + pmp_size - 1);

        /* partially inside */
        if ((s + e) == 1) {
            qemu_log_mask(LOG_GUEST_ERROR,
                          "pmp violation - access is partially inside\n");
            ret = 0;
            break;
        }

        /* fully inside */
        const uint8_t a_field =
            pmp_get_a_field(env->pmp_state.pmp[i].cfg_reg);

        /*
         * If the PMP entry is not off and the address is in range, do the priv
         * check
         */
        if (((s + e) == 2) && (PMP_AMATCH_OFF != a_field)) {
            allowed_privs = PMP_READ | PMP_WRITE | PMP_EXEC;
            if ((mode != PRV_M) || pmp_is_locked(env, i)) {
                allowed_privs &= env->pmp_state.pmp[i].cfg_reg;
            }

            if ((privs & allowed_privs) == privs) {
                ret = 1;
                break;
            } else {
                ret = 0;
                break;
            }
        }
    }

    /* No rule matched */
    if (ret == -1) {
        if (mode == PRV_M) {
            ret = 1; /* Privileged spec v1.10 states if no PMP entry matches an
                      * M-Mode access, the access succeeds */
        } else {
            ret = 0; /* Other modes are not allowed to succeed if they don't
                      * match a rule, but there are rules.  We've checked for
                      * no rule earlier in this function. */
        }
    }

    return ret == 1 ? true : false;
}